

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

void wabt::anon_unknown_1::ResolveImplicitlyDefinedFunctionType
               (Location *loc,Module *module,FuncDeclaration *decl)

{
  _Head_base<0UL,_wabt::FuncTypeModuleField_*,_false> _Var1;
  Index IVar2;
  _Head_base<0UL,_wabt::FuncTypeModuleField_*,_false> local_40;
  unique_ptr<wabt::FuncTypeModuleField,_std::default_delete<wabt::FuncTypeModuleField>_>
  func_type_field;
  
  if (decl->has_func_type == false) {
    IVar2 = Module::GetFuncTypeIndex(module,&decl->sig);
    if (IVar2 == 0xffffffff) {
      MakeUnique<wabt::FuncTypeModuleField,wabt::Location_const&>((wabt *)&local_40,loc);
      _Var1._M_head_impl = local_40._M_head_impl;
      std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator=
                ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)
                 ((long)&(local_40._M_head_impl)->func_type + 0x20),&(decl->sig).param_types);
      std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator=
                ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)
                 ((long)&(_Var1._M_head_impl)->func_type + 0x38),&(decl->sig).result_types);
      func_type_field._M_t.
      super___uniq_ptr_impl<wabt::FuncTypeModuleField,_std::default_delete<wabt::FuncTypeModuleField>_>
      ._M_t.
      super__Tuple_impl<0UL,_wabt::FuncTypeModuleField_*,_std::default_delete<wabt::FuncTypeModuleField>_>
      .super__Head_base<0UL,_wabt::FuncTypeModuleField_*,_false>._M_head_impl =
           (__uniq_ptr_data<wabt::FuncTypeModuleField,_std::default_delete<wabt::FuncTypeModuleField>,_true,_true>
            )(__uniq_ptr_data<wabt::FuncTypeModuleField,_std::default_delete<wabt::FuncTypeModuleField>,_true,_true>
              )local_40._M_head_impl;
      local_40._M_head_impl = (FuncTypeModuleField *)0x0;
      Module::AppendField(module,&func_type_field);
      if ((__uniq_ptr_impl<wabt::FuncTypeModuleField,_std::default_delete<wabt::FuncTypeModuleField>_>
           )func_type_field._M_t.
            super___uniq_ptr_impl<wabt::FuncTypeModuleField,_std::default_delete<wabt::FuncTypeModuleField>_>
            ._M_t.
            super__Tuple_impl<0UL,_wabt::FuncTypeModuleField_*,_std::default_delete<wabt::FuncTypeModuleField>_>
            .super__Head_base<0UL,_wabt::FuncTypeModuleField_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<wabt::FuncTypeModuleField,_std::default_delete<wabt::FuncTypeModuleField>_>
           )0x0) {
        (**(code **)(*(long *)func_type_field._M_t.
                              super___uniq_ptr_impl<wabt::FuncTypeModuleField,_std::default_delete<wabt::FuncTypeModuleField>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wabt::FuncTypeModuleField_*,_std::default_delete<wabt::FuncTypeModuleField>_>
                              .super__Head_base<0UL,_wabt::FuncTypeModuleField_*,_false>.
                              _M_head_impl + 8))();
      }
      func_type_field._M_t.
      super___uniq_ptr_impl<wabt::FuncTypeModuleField,_std::default_delete<wabt::FuncTypeModuleField>_>
      ._M_t.
      super__Tuple_impl<0UL,_wabt::FuncTypeModuleField_*,_std::default_delete<wabt::FuncTypeModuleField>_>
      .super__Head_base<0UL,_wabt::FuncTypeModuleField_*,_false>._M_head_impl =
           (__uniq_ptr_data<wabt::FuncTypeModuleField,_std::default_delete<wabt::FuncTypeModuleField>,_true,_true>
            )(__uniq_ptr_impl<wabt::FuncTypeModuleField,_std::default_delete<wabt::FuncTypeModuleField>_>
              )0x0;
      if (local_40._M_head_impl != (FuncTypeModuleField *)0x0) {
        (**(code **)(*(long *)local_40._M_head_impl + 8))();
      }
    }
  }
  return;
}

Assistant:

void ResolveImplicitlyDefinedFunctionType(const Location& loc,
                                          Module* module,
                                          const FuncDeclaration& decl) {
  // Resolve implicitly defined function types, e.g.: (func (param i32) ...)
  if (!decl.has_func_type) {
    Index func_type_index = module->GetFuncTypeIndex(decl.sig);
    if (func_type_index == kInvalidIndex) {
      auto func_type_field = MakeUnique<FuncTypeModuleField>(loc);
      func_type_field->func_type.sig = decl.sig;
      module->AppendField(std::move(func_type_field));
    }
  }
}